

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

ArgMaxLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_argmax(NeuralNetworkLayer *this)

{
  ArgMaxLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x401) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x401;
    this_00 = (ArgMaxLayerParams *)operator_new(0x20);
    ArgMaxLayerParams::ArgMaxLayerParams(this_00);
    (this->layer_).argmax_ = this_00;
  }
  return (ArgMaxLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgMaxLayerParams* NeuralNetworkLayer::mutable_argmax() {
  if (!has_argmax()) {
    clear_layer();
    set_has_argmax();
    layer_.argmax_ = new ::CoreML::Specification::ArgMaxLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.argMax)
  return layer_.argmax_;
}